

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::init
          (ShaderBuiltinConstantCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  int precision;
  long lVar5;
  char *pcVar6;
  string *ctx_00;
  ostringstream src;
  string local_1c0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar2 = getRefValue(this);
  local_1a0._0_8_ = ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->m_varName)._M_dataplus._M_p,
             (this->m_varName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
  std::ostream::operator<<(this_00,iVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"attribute highp vec4 a_position;\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"attribute highp vec4 a_coords;\n",0x1f);
    lVar5 = 0x1e;
    pcVar6 = "varying mediump vec4 v_color;\n";
  }
  else {
    lVar5 = 0x1f;
    pcVar6 = "varying mediump vec4 v_coords;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"void main (void)\n{\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\tbool isOk = ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->m_varName)._M_dataplus._M_p,
                      (this->m_varName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," == (",5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," + int(floor(",0xd);
  pcVar6 = "v_coords";
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar6 = "a_coords";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".x * ",5);
  de::floatToString_abi_cxx11_(&local_1c0,(de *)0x1,4.0,precision);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") + 0.05));\n",0xc);
  paVar1 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\t",1);
  uVar4 = (ulong)(this->super_ShaderRenderCase).m_isVertexCase;
  pcVar6 = "gl_FragColor";
  if (uVar4 != 0) {
    pcVar6 = "v_color";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,pcVar6,(uVar4 ^ 1) * 5 + 7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0," = isOk ? vec4(0.0, 1.0, 0.0, 1.0) : vec4(1.0, 0.0, 0.0, 1.0);\n"
             ,0x3f);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\tgl_Position = a_position;\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::stringbuf::str();
  }
  else {
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,
               "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying mediump vec4 v_coords;\n\nvoid main (void)\n{\n\tv_coords = a_coords;\n\tgl_Position = a_position;\n}\n"
               ,"");
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,
               "varying mediump vec4 v_color;\n\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n"
               ,"");
  }
  else {
    std::__cxx11::stringbuf::str();
  }
  ctx_00 = &local_1c0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)ctx_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    ctx_00 = (string *)(local_1c0.field_2._M_allocated_capacity + 1);
    operator_delete(local_1c0._M_dataplus._M_p,(ulong)ctx_00);
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  iVar2 = std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return iVar2;
}

Assistant:

void ShaderBuiltinConstantCase::init (void)
{
	const int refValue = getRefValue();
	m_testCtx.getLog() << tcu::TestLog::Message << m_varName << " = " << refValue << tcu::TestLog::EndMessage;

	static const char* defaultVertSrc =
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"	v_coords = a_coords;\n"
		"	gl_Position = a_position;\n"
		"}\n";
	static const char* defaultFragSrc =
		"varying mediump vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	// Construct shader.
	std::ostringstream src;
	if (m_isVertexCase)
	{
		src << "attribute highp vec4 a_position;\n"
			<< "attribute highp vec4 a_coords;\n"
			<< "varying mediump vec4 v_color;\n";
	}
	else
		src << "varying mediump vec4 v_coords;\n";

	src << "void main (void)\n{\n";

	src << "\tbool isOk = " << m_varName << " == (" << refValue << " + int(floor(" << (m_isVertexCase ? "a_coords" : "v_coords") << ".x * " << de::floatToString(builtinConstScale, 1) << ") + 0.05));\n";
	src << "\t" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = isOk ? vec4(0.0, 1.0, 0.0, 1.0) : vec4(1.0, 0.0, 0.0, 1.0);\n";

	if (m_isVertexCase)
		src << "\tgl_Position = a_position;\n";

	src << "}\n";

	m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
	m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

	gls::ShaderRenderCase::init();
}